

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_fma::forward
          (Eltwise_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  uint uVar4;
  Mat *m;
  Mat *this_00;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  uint uVar8;
  float *pfVar9;
  pointer pMVar10;
  float *pfVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [32];
  int iVar15;
  uint uVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  uint uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar27 [32];
  undefined1 auVar31 [32];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar4 = m->c;
  uVar20 = (ulong)uVar4;
  uVar8 = m->h * m->w * m->d * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar15 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if ((this->super_Eltwise).op_type == 0) {
      if (0 < (int)uVar4) {
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          pfVar9 = (float *)(m->cstep * uVar7 * m->elemsize + (long)m->data);
          pfVar11 = (float *)(pMVar10[1].cstep * uVar7 * pMVar10[1].elemsize + (long)pMVar10[1].data
                             );
          pauVar13 = (undefined1 (*) [32])
                     (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar8 < 8) {
            uVar16 = 0;
          }
          else {
            iVar15 = 7;
            do {
              auVar5._4_4_ = pfVar11[1] * pfVar9[1];
              auVar5._0_4_ = *pfVar11 * *pfVar9;
              auVar5._8_4_ = pfVar11[2] * pfVar9[2];
              auVar5._12_4_ = pfVar11[3] * pfVar9[3];
              auVar5._16_4_ = pfVar11[4] * pfVar9[4];
              auVar5._20_4_ = pfVar11[5] * pfVar9[5];
              auVar5._24_4_ = pfVar11[6] * pfVar9[6];
              auVar5._28_4_ = pfVar11[7];
              *pauVar13 = auVar5;
              pfVar9 = pfVar9 + 8;
              pfVar11 = pfVar11 + 8;
              pauVar13 = pauVar13 + 1;
              iVar15 = iVar15 + 8;
              uVar16 = uVar8 & 0xfffffff8;
            } while (iVar15 < (int)uVar8);
          }
          uVar19 = uVar16 | 3;
          while ((int)uVar19 < (int)uVar8) {
            auVar21._0_4_ = *pfVar11 * *pfVar9;
            auVar21._4_4_ = pfVar11[1] * pfVar9[1];
            auVar21._8_4_ = pfVar11[2] * pfVar9[2];
            auVar21._12_4_ = pfVar11[3] * pfVar9[3];
            *(undefined1 (*) [16])*pauVar13 = auVar21;
            pfVar9 = pfVar9 + 4;
            pfVar11 = pfVar11 + 4;
            pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
            uVar19 = uVar16 + 7;
            uVar16 = uVar16 + 4;
          }
          if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
            lVar17 = 0;
            do {
              *(float *)((long)*pauVar13 + lVar17 * 4) = pfVar11[lVar17] * pfVar9[lVar17];
              lVar17 = lVar17 + 1;
            } while (uVar8 - uVar16 != (int)lVar17);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar20);
      }
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar7 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar10 = pMVar10 + uVar7;
            uVar12 = 0;
            do {
              pfVar9 = (float *)(pMVar10->cstep * uVar12 * pMVar10->elemsize + (long)pMVar10->data);
              pauVar13 = (undefined1 (*) [32])
                         (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
              uVar16 = 0;
              if (7 < (int)uVar8) {
                iVar15 = 7;
                do {
                  auVar6._4_4_ = pfVar9[1] * *(float *)((long)*pauVar13 + 4);
                  auVar6._0_4_ = *pfVar9 * *(float *)*pauVar13;
                  auVar6._8_4_ = pfVar9[2] * *(float *)((long)*pauVar13 + 8);
                  auVar6._12_4_ = pfVar9[3] * *(float *)((long)*pauVar13 + 0xc);
                  auVar6._16_4_ = pfVar9[4] * *(float *)((long)*pauVar13 + 0x10);
                  auVar6._20_4_ = pfVar9[5] * *(float *)((long)*pauVar13 + 0x14);
                  auVar6._24_4_ = pfVar9[6] * *(float *)((long)*pauVar13 + 0x18);
                  auVar6._28_4_ = pfVar9[7];
                  *pauVar13 = auVar6;
                  pfVar9 = pfVar9 + 8;
                  pauVar13 = pauVar13 + 1;
                  iVar15 = iVar15 + 8;
                  uVar16 = uVar8 & 0xfffffff8;
                } while (iVar15 < (int)uVar8);
              }
              uVar19 = uVar16 | 3;
              while ((int)uVar19 < (int)uVar8) {
                auVar22._0_4_ = *pfVar9 * *(float *)*pauVar13;
                auVar22._4_4_ = pfVar9[1] * *(float *)((long)*pauVar13 + 4);
                auVar22._8_4_ = pfVar9[2] * *(float *)((long)*pauVar13 + 8);
                auVar22._12_4_ = pfVar9[3] * *(float *)((long)*pauVar13 + 0xc);
                *(undefined1 (*) [16])*pauVar13 = auVar22;
                pfVar9 = pfVar9 + 4;
                pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
                uVar19 = uVar16 + 7;
                uVar16 = uVar16 + 4;
              }
              if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
                lVar17 = 0;
                do {
                  *(float *)((long)*pauVar13 + lVar17 * 4) =
                       *(float *)((long)*pauVar13 + lVar17 * 4) * pfVar9[lVar17];
                  lVar17 = lVar17 + 1;
                } while (uVar8 - uVar16 != (int)lVar17);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar20);
          }
          uVar7 = uVar7 + 1;
          pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    if ((this->super_Eltwise).op_type == 1) {
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->super_Eltwise).coeffs.w == 0) {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            pfVar9 = (float *)(m->cstep * uVar7 * m->elemsize + (long)m->data);
            pfVar11 = (float *)(pMVar10[1].cstep * uVar7 * pMVar10[1].elemsize +
                               (long)pMVar10[1].data);
            pauVar13 = (undefined1 (*) [32])
                       (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar8 < 8) {
              uVar16 = 0;
            }
            else {
              iVar15 = 7;
              do {
                auVar28._0_4_ = *pfVar11 + *pfVar9;
                auVar28._4_4_ = pfVar11[1] + pfVar9[1];
                auVar28._8_4_ = pfVar11[2] + pfVar9[2];
                auVar28._12_4_ = pfVar11[3] + pfVar9[3];
                auVar28._16_4_ = pfVar11[4] + pfVar9[4];
                auVar28._20_4_ = pfVar11[5] + pfVar9[5];
                auVar28._24_4_ = pfVar11[6] + pfVar9[6];
                auVar28._28_4_ = pfVar11[7] + pfVar9[7];
                *pauVar13 = auVar28;
                pfVar9 = pfVar9 + 8;
                pfVar11 = pfVar11 + 8;
                pauVar13 = pauVar13 + 1;
                iVar15 = iVar15 + 8;
                uVar16 = uVar8 & 0xfffffff8;
              } while (iVar15 < (int)uVar8);
            }
            uVar19 = uVar16 | 3;
            while ((int)uVar19 < (int)uVar8) {
              auVar25._0_4_ = *pfVar11 + *pfVar9;
              auVar25._4_4_ = pfVar11[1] + pfVar9[1];
              auVar25._8_4_ = pfVar11[2] + pfVar9[2];
              auVar25._12_4_ = pfVar11[3] + pfVar9[3];
              *(undefined1 (*) [16])*pauVar13 = auVar25;
              pfVar9 = pfVar9 + 4;
              pfVar11 = pfVar11 + 4;
              pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
              uVar19 = uVar16 + 7;
              uVar16 = uVar16 + 4;
            }
            if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
              lVar17 = 0;
              do {
                *(float *)((long)*pauVar13 + lVar17 * 4) = pfVar11[lVar17] + pfVar9[lVar17];
                lVar17 = lVar17 + 1;
              } while (uVar8 - uVar16 != (int)lVar17);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar20);
        }
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar7 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar10 = pMVar10 + uVar7;
              uVar12 = 0;
              do {
                pfVar9 = (float *)(pMVar10->cstep * uVar12 * pMVar10->elemsize + (long)pMVar10->data
                                  );
                pauVar13 = (undefined1 (*) [32])
                           (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
                uVar16 = 0;
                if (7 < (int)uVar8) {
                  iVar15 = 7;
                  do {
                    auVar29._0_4_ = *pfVar9 + *(float *)*pauVar13;
                    auVar29._4_4_ = pfVar9[1] + *(float *)((long)*pauVar13 + 4);
                    auVar29._8_4_ = pfVar9[2] + *(float *)((long)*pauVar13 + 8);
                    auVar29._12_4_ = pfVar9[3] + *(float *)((long)*pauVar13 + 0xc);
                    auVar29._16_4_ = pfVar9[4] + *(float *)((long)*pauVar13 + 0x10);
                    auVar29._20_4_ = pfVar9[5] + *(float *)((long)*pauVar13 + 0x14);
                    auVar29._24_4_ = pfVar9[6] + *(float *)((long)*pauVar13 + 0x18);
                    auVar29._28_4_ = pfVar9[7] + *(float *)((long)*pauVar13 + 0x1c);
                    *pauVar13 = auVar29;
                    pfVar9 = pfVar9 + 8;
                    pauVar13 = pauVar13 + 1;
                    iVar15 = iVar15 + 8;
                    uVar16 = uVar8 & 0xfffffff8;
                  } while (iVar15 < (int)uVar8);
                }
                uVar19 = uVar16 | 3;
                while ((int)uVar19 < (int)uVar8) {
                  auVar26._0_4_ = *pfVar9 + *(float *)*pauVar13;
                  auVar26._4_4_ = pfVar9[1] + *(float *)((long)*pauVar13 + 4);
                  auVar26._8_4_ = pfVar9[2] + *(float *)((long)*pauVar13 + 8);
                  auVar26._12_4_ = pfVar9[3] + *(float *)((long)*pauVar13 + 0xc);
                  *(undefined1 (*) [16])*pauVar13 = auVar26;
                  pfVar9 = pfVar9 + 4;
                  pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
                  uVar19 = uVar16 + 7;
                  uVar16 = uVar16 + 4;
                }
                if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
                  lVar17 = 0;
                  do {
                    *(float *)((long)*pauVar13 + lVar17 * 4) =
                         *(float *)((long)*pauVar13 + lVar17 * 4) + pfVar9[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (uVar8 - uVar16 != (int)lVar17);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar20);
            }
            uVar7 = uVar7 + 1;
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar7 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar4) {
          uVar7 = 0;
          do {
            pfVar11 = (float *)(m->cstep * uVar7 * m->elemsize + (long)m->data);
            pauVar13 = (undefined1 (*) [32])
                       (pMVar10[1].cstep * uVar7 * pMVar10[1].elemsize + (long)pMVar10[1].data);
            pauVar14 = (undefined1 (*) [32])
                       (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
            pfVar9 = (float *)(this->super_Eltwise).coeffs.data;
            fVar1 = *pfVar9;
            auVar23._4_4_ = fVar1;
            auVar23._0_4_ = fVar1;
            auVar23._8_4_ = fVar1;
            auVar23._12_4_ = fVar1;
            fVar2 = pfVar9[1];
            auVar30._4_4_ = fVar2;
            auVar30._0_4_ = fVar2;
            auVar30._8_4_ = fVar2;
            auVar30._12_4_ = fVar2;
            auVar31._16_4_ = fVar2;
            auVar31._0_16_ = auVar30;
            auVar31._20_4_ = fVar2;
            auVar31._24_4_ = fVar2;
            auVar31._28_4_ = fVar2;
            if ((int)uVar8 < 8) {
              uVar16 = 0;
            }
            else {
              iVar15 = 7;
              do {
                auVar32._0_4_ = fVar1 * *pfVar11;
                auVar32._4_4_ = fVar1 * pfVar11[1];
                auVar32._8_4_ = fVar1 * pfVar11[2];
                auVar32._12_4_ = fVar1 * pfVar11[3];
                auVar32._16_4_ = fVar1 * pfVar11[4];
                auVar32._20_4_ = fVar1 * pfVar11[5];
                auVar32._28_36_ = in_ZMM2._28_36_;
                auVar32._24_4_ = fVar1 * pfVar11[6];
                auVar21 = vfmadd231ps_fma(auVar32._0_32_,auVar31,*pauVar13);
                in_ZMM2 = ZEXT1664(auVar21);
                *pauVar14 = ZEXT1632(auVar21);
                pfVar11 = pfVar11 + 8;
                pauVar13 = pauVar13 + 1;
                pauVar14 = pauVar14 + 1;
                iVar15 = iVar15 + 8;
                uVar16 = uVar8 & 0xfffffff8;
              } while (iVar15 < (int)uVar8);
            }
            if ((int)(uVar16 | 3) < (int)uVar8) {
              auVar21 = vshufps_avx(auVar23,auVar23,0);
              in_ZMM2 = ZEXT1664(auVar21);
              auVar22 = vshufps_avx(auVar30,auVar30,0);
              uVar19 = uVar16;
              do {
                auVar33._0_4_ = auVar21._0_4_ * *pfVar11;
                auVar33._4_4_ = auVar21._4_4_ * pfVar11[1];
                auVar33._8_4_ = auVar21._8_4_ * pfVar11[2];
                auVar33._12_4_ = auVar21._12_4_ * pfVar11[3];
                auVar25 = vfmadd231ps_fma(auVar33,auVar22,*(undefined1 (*) [16])*pauVar13);
                *(undefined1 (*) [16])*pauVar14 = auVar25;
                pfVar11 = pfVar11 + 4;
                pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                uVar16 = uVar19 + 4;
                iVar15 = uVar19 + 7;
                uVar19 = uVar16;
              } while (iVar15 < (int)uVar8);
            }
            if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
              lVar17 = 0;
              do {
                auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * pfVar11[lVar17])),auVar30,
                                          ZEXT416(*(uint *)(*pauVar13 + lVar17 * 4)));
                in_ZMM2 = ZEXT1664(auVar21);
                *(int *)((long)*pauVar14 + lVar17 * 4) = auVar21._0_4_;
                lVar17 = lVar17 + 1;
              } while (uVar8 - uVar16 != (int)lVar17);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar20);
        }
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar7 = 2;
          do {
            if (0 < (int)uVar4) {
              pMVar10 = pMVar10 + uVar7;
              uVar12 = 0;
              do {
                pauVar13 = (undefined1 (*) [32])
                           (pMVar10->cstep * uVar12 * pMVar10->elemsize + (long)pMVar10->data);
                pauVar14 = (undefined1 (*) [32])
                           (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
                uVar3 = *(undefined4 *)((long)(this->super_Eltwise).coeffs.data + uVar7 * 4);
                auVar24._4_4_ = uVar3;
                auVar24._0_4_ = uVar3;
                auVar24._8_4_ = uVar3;
                auVar24._12_4_ = uVar3;
                auVar27._16_4_ = uVar3;
                auVar27._0_16_ = auVar24;
                auVar27._20_4_ = uVar3;
                auVar27._24_4_ = uVar3;
                auVar27._28_4_ = uVar3;
                uVar16 = 0;
                if (7 < (int)uVar8) {
                  iVar15 = 7;
                  do {
                    auVar21 = vfmadd213ps_fma(*pauVar13,auVar27,*pauVar14);
                    *pauVar14 = ZEXT1632(auVar21);
                    pauVar13 = pauVar13 + 1;
                    pauVar14 = pauVar14 + 1;
                    iVar15 = iVar15 + 8;
                    uVar16 = uVar8 & 0xfffffff8;
                  } while (iVar15 < (int)uVar8);
                }
                if ((int)(uVar16 | 3) < (int)uVar8) {
                  auVar21 = vshufps_avx(auVar24,auVar24,0);
                  uVar19 = uVar16;
                  do {
                    auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])*pauVar13,auVar21,
                                              *(undefined1 (*) [16])*pauVar14);
                    *(undefined1 (*) [16])*pauVar14 = auVar22;
                    pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                    pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                    uVar16 = uVar19 + 4;
                    iVar15 = uVar19 + 7;
                    uVar19 = uVar16;
                  } while (iVar15 < (int)uVar8);
                }
                if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
                  lVar17 = 0;
                  do {
                    auVar21 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar13 + lVar17 * 4)),auVar24,
                                              ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)));
                    *(int *)(*pauVar14 + lVar17 * 4) = auVar21._0_4_;
                    lVar17 = lVar17 + 1;
                  } while (uVar8 - uVar16 != (int)lVar17);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar20);
            }
            uVar7 = uVar7 + 1;
            pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar7 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar15 = 0;
    if ((this->super_Eltwise).op_type == 2) {
      if (0 < (int)uVar4) {
        pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          pauVar13 = (undefined1 (*) [32])(m->cstep * uVar7 * m->elemsize + (long)m->data);
          pauVar14 = (undefined1 (*) [32])
                     (pMVar10[1].cstep * uVar7 * pMVar10[1].elemsize + (long)pMVar10[1].data);
          pauVar18 = (undefined1 (*) [32])
                     (this_00->cstep * uVar7 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar8 < 8) {
            uVar16 = 0;
          }
          else {
            iVar15 = 7;
            do {
              auVar5 = vmaxps_avx(*pauVar13,*pauVar14);
              *pauVar18 = auVar5;
              pauVar13 = pauVar13 + 1;
              pauVar14 = pauVar14 + 1;
              pauVar18 = pauVar18 + 1;
              iVar15 = iVar15 + 8;
              uVar16 = uVar8 & 0xfffffff8;
            } while (iVar15 < (int)uVar8);
          }
          uVar19 = uVar16 | 3;
          while ((int)uVar19 < (int)uVar8) {
            auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,*(undefined1 (*) [16])*pauVar14);
            *(undefined1 (*) [16])*pauVar18 = auVar21;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
            pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
            pauVar18 = (undefined1 (*) [32])((long)*pauVar18 + 0x10);
            uVar19 = uVar16 + 7;
            uVar16 = uVar16 + 4;
          }
          if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
            lVar17 = 0;
            do {
              auVar21 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)),
                                   ZEXT416(*(uint *)(*pauVar13 + lVar17 * 4)));
              *(int *)((long)*pauVar18 + lVar17 * 4) = auVar21._0_4_;
              lVar17 = lVar17 + 1;
            } while (uVar8 - uVar16 != (int)lVar17);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar20);
      }
      pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar15 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar10 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar7 = 2;
        do {
          if (0 < (int)uVar4) {
            pMVar10 = pMVar10 + uVar7;
            uVar12 = 0;
            do {
              pauVar13 = (undefined1 (*) [32])
                         (pMVar10->cstep * uVar12 * pMVar10->elemsize + (long)pMVar10->data);
              pauVar14 = (undefined1 (*) [32])
                         (this_00->cstep * uVar12 * this_00->elemsize + (long)this_00->data);
              uVar16 = 0;
              if (7 < (int)uVar8) {
                iVar15 = 7;
                do {
                  auVar5 = vmaxps_avx(*pauVar14,*pauVar13);
                  *pauVar14 = auVar5;
                  pauVar13 = pauVar13 + 1;
                  pauVar14 = pauVar14 + 1;
                  iVar15 = iVar15 + 8;
                  uVar16 = uVar8 & 0xfffffff8;
                } while (iVar15 < (int)uVar8);
              }
              uVar19 = uVar16 | 3;
              while ((int)uVar19 < (int)uVar8) {
                auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar14,*(undefined1 (*) [16])*pauVar13
                                    );
                *(undefined1 (*) [16])*pauVar14 = auVar21;
                pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                uVar19 = uVar16 + 7;
                uVar16 = uVar16 + 4;
              }
              if (uVar8 - uVar16 != 0 && (int)uVar16 <= (int)uVar8) {
                lVar17 = 0;
                do {
                  auVar21 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)),
                                       ZEXT416(*(uint *)(*pauVar13 + lVar17 * 4)));
                  *(int *)(*pauVar14 + lVar17 * 4) = auVar21._0_4_;
                  lVar17 = lVar17 + 1;
                } while (uVar8 - uVar16 != (int)lVar17);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar20);
          }
          uVar7 = uVar7 + 1;
          pMVar10 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10 >>
                                 3) * -0x71c71c71c71c71c7));
        iVar15 = 0;
      }
    }
  }
  return iVar15;
}

Assistant:

int Eltwise_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * d * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}